

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::StateMachine::API_Request(StateMachine *this,AppRequest *request)

{
  undefined8 uVar1;
  bool bVar2;
  uint16_t *in_RSI;
  mutex_type *in_RDI;
  AppRequest *r;
  iterator __end2;
  iterator __begin2;
  vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_> *__range2;
  bool found;
  lock_guard<std::mutex> locker;
  undefined1 __i;
  AsioHost *in_stack_ffffffffffffffb0;
  value_type *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<tonk::gateway::AppRequest_*,_std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>_>
  local_30;
  undefined1 *local_28;
  byte local_19;
  uint16_t *local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,in_RDI);
  local_19 = 0;
  local_28 = (undefined1 *)((long)&in_RDI[1].super___mutex_base._M_mutex + 0x18);
  local_30._M_current =
       (AppRequest *)
       std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>::begin
                 ((vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_> *)
                  in_RDI);
  std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>::end
            ((vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_> *)in_RDI
            );
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<tonk::gateway::AppRequest_*,_std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<tonk::gateway::AppRequest_*,_std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>_>
                        *)in_RDI);
    if (!bVar2) {
LAB_00198bfa:
      __i = (undefined1)((ulong)in_RDI >> 0x38);
      if ((local_19 & 1) == 0) {
        std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>::
        push_back((vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_> *)
                  in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      std::atomic<bool>::operator=((atomic<bool> *)in_stack_ffffffffffffffb0,(bool)__i);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x198c4d);
      AsioHost::DispatchTick(in_stack_ffffffffffffffb0);
      return;
    }
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<tonk::gateway::AppRequest_*,_std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>_>
         ::operator*(&local_30);
    if (in_stack_ffffffffffffffc0->LocalPort == *local_10) {
      uVar1 = *(undefined8 *)local_10;
      in_stack_ffffffffffffffc0->LocalPort = (short)uVar1;
      *(short *)&in_stack_ffffffffffffffc0->field_0x2 = (short)((ulong)uVar1 >> 0x10);
      in_stack_ffffffffffffffc0->Type = (int)((ulong)uVar1 >> 0x20);
      in_stack_ffffffffffffffc0->API_LifetimePtr = *(MappedPortLifetime **)(local_10 + 4);
      local_19 = 1;
      goto LAB_00198bfa;
    }
    __gnu_cxx::
    __normal_iterator<tonk::gateway::AppRequest_*,_std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

void StateMachine::API_Request(const AppRequest& request)
{
    TONK_DEBUG_ASSERT(request.LocalPort != 0);

    // This will be called from the application

    // Hold API lock while accessing the requests list
    {
        std::lock_guard<std::mutex> locker(API_Lock);

        bool found = false;
        for (auto& r : API_Requests)
        {
            // Note: Requests are uniquely identified by ports
            if (r.LocalPort == request.LocalPort)
            {
                r = request;
                found = true;
                break;
            }
        }

        if (!found) {
            API_Requests.push_back(request);
        }

        // Set the dirty flag
        API_Requests_Updated = true;
    }

    // Run OnTick() immediately
    Host->DispatchTick();
}